

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O3

void SSL_get0_ech_name_override(SSL *ssl,char **out_name,size_t *out_name_len)

{
  SSL_HANDSHAKE *pSVar1;
  size_t sVar2;
  
  pSVar1 = (ssl->s3->hs)._M_t.super___uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>.
           _M_t.super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>._M_head_impl;
  if (((pSVar1 == (SSL_HANDSHAKE *)0x0) || ((ssl->field_0xa4 & 1) != 0)) ||
     (ssl->s3->ech_status != ssl_ech_rejected)) {
    *out_name = (char *)0x0;
    sVar2 = 0;
  }
  else {
    *out_name = *(char **)((long)(pSVar1->selected_ech_config)._M_t.
                                 super___uniq_ptr_impl<bssl::ECHConfig,_bssl::internal::Deleter> +
                          0x20);
    sVar2 = *(size_t *)
             ((long)(pSVar1->selected_ech_config)._M_t.
                    super___uniq_ptr_impl<bssl::ECHConfig,_bssl::internal::Deleter> + 0x28);
  }
  *out_name_len = sVar2;
  return;
}

Assistant:

void SSL_get0_ech_name_override(const SSL *ssl, const char **out_name,
                                size_t *out_name_len) {
  // When ECH is rejected, we use the public name. Note that, if
  // |SSL_CTX_set_reverify_on_resume| is enabled, we reverify the certificate
  // before the 0-RTT point. If also offering ECH, we verify as if
  // ClientHelloInner was accepted and do not override. This works because, at
  // this point, |ech_status| will be |ssl_ech_none|. See the
  // ECH-Client-Reject-EarlyDataReject-OverrideNameOnRetry tests in runner.go.
  const SSL_HANDSHAKE *hs = ssl->s3->hs.get();
  if (!ssl->server && hs && ssl->s3->ech_status == ssl_ech_rejected) {
    *out_name = reinterpret_cast<const char *>(
        hs->selected_ech_config->public_name.data());
    *out_name_len = hs->selected_ech_config->public_name.size();
  } else {
    *out_name = nullptr;
    *out_name_len = 0;
  }
}